

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void internal_counters_set_mgga(int nspin,xc_dimensions *dim)

{
  long in_RSI;
  int in_EDI;
  xc_dimensions *in_stack_ffffffffffffffe8;
  
  internal_counters_set_gga((int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe8);
  *(int *)(in_RSI + 0x1c) = in_EDI;
  *(int *)(in_RSI + 8) = in_EDI;
  *(int *)(in_RSI + 0x20) = in_EDI;
  *(int *)(in_RSI + 0xc) = in_EDI;
  if (in_EDI == 1) {
    *(undefined4 *)(in_RSI + 0x48) = 1;
    *(undefined4 *)(in_RSI + 0x40) = 1;
    *(undefined4 *)(in_RSI + 0x44) = 1;
    *(undefined4 *)(in_RSI + 0x30) = 1;
    *(undefined4 *)(in_RSI + 0x2c) = 1;
    *(undefined4 *)(in_RSI + 0x3c) = 1;
    *(undefined4 *)(in_RSI + 0x38) = 1;
    *(undefined4 *)(in_RSI + 0x68) = 1;
    *(undefined4 *)(in_RSI + 0x58) = 1;
    *(undefined4 *)(in_RSI + 0x54) = 1;
    *(undefined4 *)(in_RSI + 0x98) = 1;
    *(undefined4 *)(in_RSI + 0x8c) = 1;
    *(undefined4 *)(in_RSI + 0x6c) = 1;
    *(undefined4 *)(in_RSI + 0x94) = 1;
    *(undefined4 *)(in_RSI + 0x90) = 1;
    *(undefined4 *)(in_RSI + 0x70) = 1;
    *(undefined4 *)(in_RSI + 0x7c) = 1;
    *(undefined4 *)(in_RSI + 0x78) = 1;
    *(undefined4 *)(in_RSI + 0x88) = 1;
    *(undefined4 *)(in_RSI + 0x80) = 1;
    *(undefined4 *)(in_RSI + 0x84) = 1;
    *(undefined4 *)(in_RSI + 100) = 1;
    *(undefined4 *)(in_RSI + 0x60) = 1;
    *(undefined4 *)(in_RSI + 0xac) = 1;
    *(undefined4 *)(in_RSI + 0xa8) = 1;
    *(undefined4 *)(in_RSI + 0xa4) = 1;
    *(undefined4 *)(in_RSI + 0xa0) = 1;
    *(undefined4 *)(in_RSI + 0x9c) = 1;
    *(undefined4 *)(in_RSI + 0xbc) = 1;
    *(undefined4 *)(in_RSI + 0xb8) = 1;
    *(undefined4 *)(in_RSI + 0xb4) = 1;
    *(undefined4 *)(in_RSI + 0xb0) = 1;
    *(undefined4 *)(in_RSI + 0xcc) = 1;
    *(undefined4 *)(in_RSI + 200) = 1;
    *(undefined4 *)(in_RSI + 0xc4) = 1;
    *(undefined4 *)(in_RSI + 0xc0) = 1;
    *(undefined4 *)(in_RSI + 0xd8) = 1;
    *(undefined4 *)(in_RSI + 0xd4) = 1;
    *(undefined4 *)(in_RSI + 0xd0) = 1;
    *(undefined4 *)(in_RSI + 0xe8) = 1;
    *(undefined4 *)(in_RSI + 0xe4) = 1;
    *(undefined4 *)(in_RSI + 0xe0) = 1;
    *(undefined4 *)(in_RSI + 0xdc) = 1;
    *(undefined4 *)(in_RSI + 0xf8) = 1;
    *(undefined4 *)(in_RSI + 0xf4) = 1;
    *(undefined4 *)(in_RSI + 0xf0) = 1;
    *(undefined4 *)(in_RSI + 0xec) = 1;
    *(undefined4 *)(in_RSI + 0x108) = 1;
    *(undefined4 *)(in_RSI + 0x104) = 1;
    *(undefined4 *)(in_RSI + 0x100) = 1;
    *(undefined4 *)(in_RSI + 0xfc) = 1;
    *(undefined4 *)(in_RSI + 0x118) = 1;
    *(undefined4 *)(in_RSI + 0x114) = 1;
    *(undefined4 *)(in_RSI + 0x110) = 1;
    *(undefined4 *)(in_RSI + 0x10c) = 1;
    *(undefined4 *)(in_RSI + 0x124) = 1;
    *(undefined4 *)(in_RSI + 0x120) = 1;
    *(undefined4 *)(in_RSI + 0x11c) = 1;
  }
  else {
    *(undefined4 *)(in_RSI + 0x1c) = 2;
    *(undefined4 *)(in_RSI + 0x20) = 2;
    *(undefined4 *)(in_RSI + 0x2c) = 4;
    *(undefined4 *)(in_RSI + 0x30) = 4;
    *(undefined4 *)(in_RSI + 0x38) = 6;
    *(undefined4 *)(in_RSI + 0x3c) = 6;
    *(undefined4 *)(in_RSI + 0x40) = 3;
    *(undefined4 *)(in_RSI + 0x44) = 4;
    *(undefined4 *)(in_RSI + 0x48) = 3;
    *(undefined4 *)(in_RSI + 0x54) = 6;
    *(undefined4 *)(in_RSI + 0x58) = 6;
    *(undefined4 *)(in_RSI + 0x60) = 0xc;
    *(undefined4 *)(in_RSI + 100) = 0xc;
    *(undefined4 *)(in_RSI + 0x68) = 6;
    *(undefined4 *)(in_RSI + 0x6c) = 8;
    *(undefined4 *)(in_RSI + 0x70) = 6;
    *(undefined4 *)(in_RSI + 0x78) = 0xc;
    *(undefined4 *)(in_RSI + 0x7c) = 0xc;
    *(undefined4 *)(in_RSI + 0x80) = 9;
    *(undefined4 *)(in_RSI + 0x84) = 0xc;
    *(undefined4 *)(in_RSI + 0x88) = 9;
    *(undefined4 *)(in_RSI + 0x8c) = 4;
    *(undefined4 *)(in_RSI + 0x90) = 6;
    *(undefined4 *)(in_RSI + 0x94) = 6;
    *(undefined4 *)(in_RSI + 0x98) = 4;
    *(undefined4 *)(in_RSI + 0xa4) = 8;
    *(undefined4 *)(in_RSI + 0xa8) = 8;
    *(undefined4 *)(in_RSI + 0xb0) = 0x12;
    *(undefined4 *)(in_RSI + 0xb4) = 0x12;
    *(undefined4 *)(in_RSI + 0xb8) = 9;
    *(undefined4 *)(in_RSI + 0xbc) = 0xc;
    *(undefined4 *)(in_RSI + 0xc0) = 9;
    *(undefined4 *)(in_RSI + 200) = 0x18;
    *(undefined4 *)(in_RSI + 0xcc) = 0x18;
    *(undefined4 *)(in_RSI + 0xd0) = 0x12;
    *(undefined4 *)(in_RSI + 0xd4) = 0x18;
    *(undefined4 *)(in_RSI + 0xd8) = 0x12;
    *(undefined4 *)(in_RSI + 0xdc) = 8;
    *(undefined4 *)(in_RSI + 0xe0) = 0xc;
    *(undefined4 *)(in_RSI + 0xe4) = 0xc;
    *(undefined4 *)(in_RSI + 0xe8) = 8;
    *(undefined4 *)(in_RSI + 0xf0) = 0x14;
    *(undefined4 *)(in_RSI + 0xf4) = 0x14;
    *(undefined4 *)(in_RSI + 0xf8) = 0x12;
    *(undefined4 *)(in_RSI + 0xfc) = 0x18;
    *(undefined4 *)(in_RSI + 0x100) = 0x12;
    *(undefined4 *)(in_RSI + 0x104) = 0xc;
    *(undefined4 *)(in_RSI + 0x108) = 0x12;
    *(undefined4 *)(in_RSI + 0x10c) = 0x12;
    *(undefined4 *)(in_RSI + 0x110) = 0xc;
    *(undefined4 *)(in_RSI + 0x114) = 5;
    *(undefined4 *)(in_RSI + 0x118) = 8;
    *(undefined4 *)(in_RSI + 0x11c) = 9;
    *(undefined4 *)(in_RSI + 0x120) = 8;
    *(undefined4 *)(in_RSI + 0x124) = 5;
  }
  return;
}

Assistant:

void
internal_counters_set_mgga(int nspin, xc_dimensions *dim)
{
  internal_counters_set_gga(nspin, dim);
  dim->lapl = dim->vlapl = nspin;
  dim->tau  = dim->vtau  = nspin;

  if(nspin == XC_UNPOLARIZED){
    dim->v2lapl2 = dim->v2tau2 = 1;
    dim->v2rholapl = dim->v2rhotau = dim->v2lapltau = 1;
    dim->v2sigmalapl = dim->v2sigmatau = 1;

    dim->v3lapl3 = dim->v3tau3 = dim->v3rho2lapl = dim->v3rho2tau = dim->v3rholapl2 = 1;
    dim->v3rhotau2 = dim->v3lapl2tau = dim->v3lapltau2 = dim->v3rholapltau = 1;
    dim->v3sigmalapl2 = dim->v3sigmatau2 = dim->v3sigma2lapl = dim->v3sigma2tau = 1;
    dim->v3rhosigmalapl = dim->v3rhosigmatau = dim->v3sigmalapltau = 1;

    dim->v4rho4 = dim->v4rho3sigma = dim->v4rho3lapl = dim->v4rho3tau = dim->v4rho2sigma2 = 1;
    dim->v4rho2sigmalapl = dim->v4rho2sigmatau = dim->v4rho2lapl2 = dim->v4rho2lapltau = 1;
    dim->v4rho2tau2 = dim->v4rhosigma3 = dim->v4rhosigma2lapl = dim->v4rhosigma2tau = 1;
    dim->v4rhosigmalapl2 = dim->v4rhosigmalapltau = dim->v4rhosigmatau2 = 1;
    dim->v4rholapl3 = dim->v4rholapl2tau = dim->v4rholapltau2 = dim->v4rhotau3 = 1;
    dim->v4sigma4 = dim->v4sigma3lapl = dim->v4sigma3tau = dim->v4sigma2lapl2 = 1;
    dim->v4sigma2lapltau = dim->v4sigma2tau2 = dim->v4sigmalapl3 = dim->v4sigmalapl2tau = 1;
    dim->v4sigmalapltau2 = dim->v4sigmatau3 = dim->v4lapl4 = dim->v4lapl3tau = 1;
    dim->v4lapl2tau2 = dim->v4lapltau3 = dim->v4tau4 =1;
  }else{
    dim->vlapl             = 2;
    dim->vtau              = 2;

    /* in total: 30 */
    dim->v2rholapl         = 2*2;
    dim->v2rhotau          = 2*2;
    dim->v2sigmalapl       = 3*2;
    dim->v2sigmatau        = 3*2;
    dim->v2lapl2           = 3;
    dim->v2lapltau         = 2*2;
    dim->v2tau2            = 3;

    /* in total: 130 */
    dim->v3rho2lapl        = 3*2;
    dim->v3rho2tau         = 3*2;
    dim->v3rhosigmalapl    = 2*3*2;
    dim->v3rhosigmatau     = 2*3*2;
    dim->v3rholapl2        = 2*3;
    dim->v3rholapltau      = 2*2*2;
    dim->v3rhotau2         = 2*3;
    dim->v3sigma2lapl      = 6*2;
    dim->v3sigma2tau       = 6*2;
    dim->v3sigmalapl2      = 3*3;
    dim->v3sigmalapltau    = 3*2*2;
    dim->v3sigmatau2       = 3*3;
    dim->v3lapl3           = 4;
    dim->v3lapl2tau        = 3*2;
    dim->v3lapltau2        = 2*3;
    dim->v3tau3            = 4;

    /* in total: 425 */
    dim->v4rho3lapl        = 4*2;
    dim->v4rho3tau         = 4*2;
    dim->v4rho2sigmalapl   = 3*3*2;
    dim->v4rho2sigmatau    = 3*3*2;
    dim->v4rho2lapl2       = 3*3;
    dim->v4rho2lapltau     = 3*2*2;
    dim->v4rho2tau2        = 3*3;
    dim->v4rhosigma2lapl   = 2*6*2;
    dim->v4rhosigma2tau    = 2*6*2;
    dim->v4rhosigmalapl2   = 2*3*3;
    dim->v4rhosigmalapltau = 2*3*2*2;
    dim->v4rhosigmatau2    = 2*3*3;
    dim->v4rholapl3        = 2*4;
    dim->v4rholapl2tau     = 2*3*2;
    dim->v4rholapltau2     = 2*2*3;
    dim->v4rhotau3         = 2*4;
    dim->v4sigma3lapl      = 10*2;
    dim->v4sigma3tau       = 10*2;
    dim->v4sigma2lapl2     = 6*3;
    dim->v4sigma2lapltau   = 6*2*2;
    dim->v4sigma2tau2      = 6*3;
    dim->v4sigmalapl3      = 3*4;
    dim->v4sigmalapl2tau   = 3*3*2;
    dim->v4sigmalapltau2   = 3*2*3;
    dim->v4sigmatau3       = 3*4;
    dim->v4lapl4           = 5;
    dim->v4lapl3tau        = 4*2;
    dim->v4lapl2tau2       = 3*3;
    dim->v4lapltau3        = 2*4;
    dim->v4tau4            = 5;
  }
}